

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compareDwa.cpp
# Opt level: O3

void compareDwa(int width,int height,Array2D<Imf_3_4::Rgba> *src,Array2D<Imf_3_4::Rgba> *test,
               RgbaChannels channels)

{
  float fVar1;
  half hVar2;
  half hVar3;
  Rgba *pRVar4;
  half *phVar5;
  ulong uVar6;
  int iVar7;
  half *phVar8;
  ulong uVar9;
  float fVar10;
  
  if (0 < height) {
    uVar9 = 0;
    do {
      if (0 < width) {
        uVar6 = 0;
        do {
          iVar7 = 0;
          do {
            if (iVar7 == 2) {
              if ((channels & WRITE_B) == 0) break;
              hVar2 = toNonlinear(src->_data[src->_sizeY * uVar9 + uVar6].b._h);
              pRVar4 = (Rgba *)&test->_data[test->_sizeY * uVar9 + uVar6].b;
LAB_00122964:
              hVar3 = toNonlinear((pRVar4->r)._h);
              if (hVar2._h == 0) {
                if ((*_imath_half_to_float_table == _imath_half_to_float_table[hVar3._h]) &&
                   (!NAN(*_imath_half_to_float_table) && !NAN(_imath_half_to_float_table[hVar3._h]))
                   ) {
                  __assert_fail("srcNonlin != testNonlin",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/compareDwa.cpp"
                                ,0x61,
                                "void compareDwa(int, int, const Array2D<Rgba> &, const Array2D<Rgba> &, RgbaChannels)"
                               );
                }
              }
              else {
                fVar1 = _imath_half_to_float_table[hVar2._h];
                if (0.1 <= ABS(fVar1)) {
                  fVar10 = ABS((fVar1 - _imath_half_to_float_table[hVar3._h]) / fVar1);
                  if (0.25 <= ABS(fVar1)) {
                    if (0.1 <= fVar10) {
                      __assert_fail("relError < .1",
                                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/compareDwa.cpp"
                                    ,0x5f,
                                    "void compareDwa(int, int, const Array2D<Rgba> &, const Array2D<Rgba> &, RgbaChannels)"
                                   );
                    }
                  }
                  else if (0.25 <= fVar10) {
                    __assert_fail("relError < .25",
                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/compareDwa.cpp"
                                  ,0x5e,
                                  "void compareDwa(int, int, const Array2D<Rgba> &, const Array2D<Rgba> &, RgbaChannels)"
                                 );
                  }
                }
              }
            }
            else if (iVar7 == 1) {
              if ((channels & WRITE_G) != 0) {
                hVar2 = toNonlinear(src->_data[src->_sizeY * uVar9 + uVar6].g._h);
                pRVar4 = (Rgba *)&test->_data[test->_sizeY * uVar9 + uVar6].g;
                goto LAB_00122964;
              }
            }
            else if ((channels & WRITE_R) != 0) {
              hVar2 = toNonlinear(src->_data[src->_sizeY * uVar9 + uVar6].r._h);
              pRVar4 = test->_data + test->_sizeY * uVar9 + uVar6;
              goto LAB_00122964;
            }
            iVar7 = iVar7 + 1;
          } while (iVar7 != 3);
          uVar6 = uVar6 + 1;
        } while (uVar6 != (uint)width);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != (uint)height);
    if ((channels & WRITE_A) != 0 && 0 < height) {
      phVar5 = &src->_data->a;
      phVar8 = &test->_data->a;
      uVar9 = 0;
      do {
        if (0 < width) {
          uVar6 = 0;
          do {
            if ((_imath_half_to_float_table[phVar5[uVar6 * 4]._h] !=
                 _imath_half_to_float_table[phVar8[uVar6 * 4]._h]) ||
               (NAN(_imath_half_to_float_table[phVar5[uVar6 * 4]._h]) ||
                NAN(_imath_half_to_float_table[phVar8[uVar6 * 4]._h]))) {
              __assert_fail("src[y][x].a == test[y][x].a",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/compareDwa.cpp"
                            ,0x6f,
                            "void compareDwa(int, int, const Array2D<Rgba> &, const Array2D<Rgba> &, RgbaChannels)"
                           );
            }
            uVar6 = uVar6 + 1;
          } while ((uint)width != uVar6);
        }
        uVar9 = uVar9 + 1;
        phVar5 = phVar5 + src->_sizeY * 4;
        phVar8 = phVar8 + test->_sizeY * 4;
      } while (uVar9 != (uint)height);
    }
  }
  return;
}

Assistant:

void
compareDwa (
    int                  width,
    int                  height,
    const Array2D<Rgba>& src,
    const Array2D<Rgba>& test,
    RgbaChannels         channels)
{
    half  srcNonlin, testNonlin;
    float relError;

    for (int y = 0; y < height; ++y)
    {
        for (int x = 0; x < width; ++x)
        {

            for (int comp = 0; comp < 3; ++comp)
            {
                switch (comp)
                {
                    case 0:
                        if (!(channels & WRITE_R)) continue;

                        srcNonlin  = toNonlinear (src[y][x].r);
                        testNonlin = toNonlinear (test[y][x].r);
                        break;
                    case 1:
                        if (!(channels & WRITE_G)) continue;

                        srcNonlin  = toNonlinear (src[y][x].g);
                        testNonlin = toNonlinear (test[y][x].g);
                        break;
                    case 2:
                        if (!(channels & WRITE_B)) continue;

                        srcNonlin  = toNonlinear (src[y][x].b);
                        testNonlin = toNonlinear (test[y][x].b);
                        break;
                }

                //
                // Try to compare with relative error. This breaks down
                // for small numbers, which could be quantiezed to 0
                // giving 100% error.
                //
                if (srcNonlin.bits () != 0x00)
                {

                    relError = fabs ((float) srcNonlin - (float) testNonlin) /
                               fabs ((float) srcNonlin);

                    if (fabs (srcNonlin) < .1) continue;

                    if (fabs (srcNonlin) < .25) { assert (relError < .25); }
                    else { assert (relError < .1); }
                }
                else { assert (srcNonlin != testNonlin); }
            }
        }
    }

    //
    // Test alpha, if necessary
    //
    if (channels & WRITE_A)
    {
        for (int y = 0; y < height; ++y)
        {
            for (int x = 0; x < width; ++x)
            {
                assert (src[y][x].a == test[y][x].a);
            }
        }
    }
}